

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::EvaluateSectionPoint
          (ChElementShellANCF_3423 *this,double u,double v,ChVector<double> *point)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pointer psVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double x;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double y;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  psVar10 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar11 = psVar10[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar12 = (psVar10->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  peVar13 = psVar10[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar14 = psVar10[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  dVar15 = (u + 1.0) * 0.25;
  dVar16 = (1.0 - u) * 0.25;
  dVar17 = dVar15 * (1.0 - v);
  dVar18 = dVar16 * (1.0 - v);
  dVar15 = dVar15 * (v + 1.0);
  dVar16 = dVar16 * (v + 1.0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)((long)&peVar12->super_ChNodeFEAxyz + 0x20);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar17 * *(double *)((long)&peVar11->super_ChNodeFEAxyz + 0x20);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar18;
  auVar1 = vfmadd231sd_fma(auVar23,auVar26,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)((long)&peVar13->super_ChNodeFEAxyz + 0x20);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar15;
  auVar1 = vfmadd231sd_fma(auVar1,auVar19,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)((long)&peVar14->super_ChNodeFEAxyz + 0x20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar16;
  auVar1 = vfmadd231sd_fma(auVar1,auVar21,auVar3);
  point->m_data[0] = auVar1._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)((long)&peVar12->super_ChNodeFEAxyz + 0x28);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar17 * *(double *)((long)&peVar11->super_ChNodeFEAxyz + 0x28);
  auVar1 = vfmadd231sd_fma(auVar24,auVar26,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)((long)&peVar13->super_ChNodeFEAxyz + 0x28);
  auVar1 = vfmadd231sd_fma(auVar1,auVar19,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)((long)&peVar14->super_ChNodeFEAxyz + 0x28);
  auVar1 = vfmadd231sd_fma(auVar1,auVar21,auVar6);
  point->m_data[1] = auVar1._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)((long)&peVar12->super_ChNodeFEAxyz + 0x30);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar17 * *(double *)((long)&peVar11->super_ChNodeFEAxyz + 0x30);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar18;
  auVar1 = vfmadd231sd_fma(auVar25,auVar27,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)((long)&peVar13->super_ChNodeFEAxyz + 0x30);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar15;
  auVar1 = vfmadd231sd_fma(auVar1,auVar20,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)((long)&peVar14->super_ChNodeFEAxyz + 0x30);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar16;
  auVar1 = vfmadd231sd_fma(auVar1,auVar22,auVar9);
  point->m_data[2] = auVar1._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3423::EvaluateSectionPoint(const double u, const double v, ChVector<>& point) {
    ChVector<> u_displ;

    double x = u;  // because ShapeFunctions() works in -1..1 range
    double y = v;  // because ShapeFunctions() works in -1..1 range
    double z = 0;
    ShapeVector N;
    ShapeFunctions(N, x, y, z);

    const ChVector<>& pA = m_nodes[0]->GetPos();
    const ChVector<>& pB = m_nodes[1]->GetPos();
    const ChVector<>& pC = m_nodes[2]->GetPos();
    const ChVector<>& pD = m_nodes[3]->GetPos();

    point.x() = N(0) * pA.x() + N(2) * pB.x() + N(4) * pC.x() + N(6) * pD.x();
    point.y() = N(0) * pA.y() + N(2) * pB.y() + N(4) * pC.y() + N(6) * pD.y();
    point.z() = N(0) * pA.z() + N(2) * pB.z() + N(4) * pC.z() + N(6) * pD.z();
}